

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::GdiNv3::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,GdiNv3 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdBitmapColor1 *pMVar1;
  MthdBitmapColor0 *pMVar2;
  MthdClipXy *pMVar3;
  MthdSolidColor *pMVar4;
  MthdRect *pMVar5;
  MthdBitmapFormat *pMVar6;
  MthdSolidFormat *pMVar7;
  MthdOperation *pMVar8;
  MthdMissing *pMVar9;
  MthdCtxSurf *pMVar10;
  MthdCtxBeta *pMVar11;
  MthdCtxRop *pMVar12;
  MthdCtxPattern *pMVar13;
  MthdDmaNotify *pMVar14;
  MthdPmTrigger *pMVar15;
  MthdPatch *pMVar16;
  MthdNotify *pMVar17;
  SingleMthdTest *pSVar18;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar19;
  result_type rVar20;
  MthdIfcSize *pMVar21;
  MthdVtxXy *pMVar22;
  MthdBitmapData *pMVar23;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_833;
  allocator local_832;
  allocator local_831;
  allocator local_830;
  allocator local_82f;
  allocator local_82e;
  allocator local_82d;
  allocator local_82c;
  allocator local_82b;
  allocator local_82a;
  allocator local_829;
  allocator local_828;
  allocator local_827;
  allocator local_826;
  allocator local_825;
  allocator local_824;
  allocator local_823;
  allocator local_822;
  allocator local_821;
  allocator local_820;
  allocator local_81f;
  allocator local_81e;
  allocator local_81d;
  allocator local_81c;
  allocator local_81b;
  allocator local_81a;
  allocator local_819;
  allocator local_818;
  allocator local_817;
  allocator local_816;
  allocator local_815;
  allocator local_814;
  allocator local_813;
  allocator local_812;
  allocator local_811;
  allocator local_810;
  allocator local_80f;
  allocator local_80e;
  allocator local_80d;
  allocator local_80c;
  allocator local_80b;
  allocator local_80a;
  allocator local_809;
  MthdIfcSize *local_808;
  MthdBitmapColor1 *local_800;
  MthdBitmapColor0 *local_7f8;
  MthdClipXy *local_7f0;
  MthdClipXy *local_7e8;
  MthdBitmapData *local_7e0;
  MthdVtxXy *local_7d8;
  MthdIfcSize *local_7d0;
  MthdIfcSize *local_7c8;
  MthdBitmapColor1 *local_7c0;
  MthdClipXy *local_7b8;
  MthdClipXy *local_7b0;
  MthdBitmapData *local_7a8;
  MthdVtxXy *local_7a0;
  MthdIfcSize *local_798;
  MthdBitmapColor1 *local_790;
  MthdClipXy *local_788;
  MthdClipXy *local_780;
  MthdVtxXy *local_778;
  MthdVtxXy *local_770;
  MthdSolidColor *local_768;
  MthdClipXy *local_760;
  MthdClipXy *local_758;
  MthdRect *local_750;
  MthdVtxXy *local_748;
  MthdSolidColor *local_740;
  MthdBitmapFormat *local_738;
  MthdSolidFormat *local_730;
  MthdOperation *local_728;
  MthdMissing *local_720;
  MthdCtxSurf *local_718;
  MthdCtxBeta *local_710;
  MthdCtxRop *local_708;
  MthdCtxPattern *local_700;
  MthdDmaNotify *local_6f8;
  MthdPmTrigger *local_6f0;
  MthdPatch *local_6e8;
  MthdNotify *local_6e0;
  SingleMthdTest *local_6d8;
  MthdIfcSize *local_6d0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_6c8;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  SingleMthdTest *local_180;
  MthdNotify *local_178;
  MthdPatch *local_170;
  MthdPmTrigger *local_168;
  MthdDmaNotify *local_160;
  MthdCtxPattern *local_158;
  MthdCtxRop *local_150;
  MthdCtxBeta *local_148;
  MthdCtxSurf *local_140;
  MthdMissing *local_138;
  MthdOperation *local_130;
  MthdSolidFormat *local_128;
  MthdBitmapFormat *local_120;
  MthdSolidColor *local_118;
  MthdVtxXy *local_110;
  MthdRect *local_108;
  MthdClipXy *local_100;
  MthdClipXy *local_f8;
  MthdSolidColor *local_f0;
  MthdVtxXy *local_e8;
  MthdVtxXy *local_e0;
  MthdClipXy *local_d8;
  MthdClipXy *local_d0;
  MthdBitmapColor1 *local_c8;
  MthdIfcSize *local_c0;
  MthdVtxXy *local_b8;
  MthdBitmapData *local_b0;
  MthdClipXy *local_a8;
  MthdClipXy *local_a0;
  MthdBitmapColor1 *local_98;
  MthdIfcSize *local_90;
  MthdIfcSize *local_88;
  MthdVtxXy *local_80;
  MthdBitmapData *local_78;
  MthdClipXy *local_70;
  MthdClipXy *local_68;
  MthdBitmapColor0 *local_60;
  MthdBitmapColor1 *local_58;
  MthdIfcSize *local_50;
  MthdIfcSize *local_48;
  MthdVtxXy *local_40;
  MthdBitmapData *local_38;
  
  local_6d8 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  local_6c8 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_1a0,"nop",&local_809);
  pSVar18 = local_6d8;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_6d8,opt,(uint32_t)rVar20,&local_1a0,-1,(this->super_Class).cls,0x100,1
             ,4);
  local_180 = pSVar18;
  local_6e0 = (MthdNotify *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1c0,"notify",&local_80a);
  pMVar17 = local_6e0;
  MthdNotify::SingleMthdTest
            (local_6e0,opt,(uint32_t)rVar20,&local_1c0,0,(this->super_Class).cls,0x104,1,4);
  local_178 = pMVar17;
  local_6e8 = (MthdPatch *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1e0,"patch",&local_80b);
  pMVar16 = local_6e8;
  MthdPatch::SingleMthdTest
            (local_6e8,opt,(uint32_t)rVar20,&local_1e0,-1,(this->super_Class).cls,0x10c,1,4);
  local_170 = pMVar16;
  local_6f0 = (MthdPmTrigger *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_200,"pm_trigger",&local_80c);
  pMVar15 = local_6f0;
  MthdPmTrigger::SingleMthdTest
            (local_6f0,opt,(uint32_t)rVar20,&local_200,-1,(this->super_Class).cls,0x140,1,4);
  local_168 = pMVar15;
  local_6f8 = (MthdDmaNotify *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_220,"dma_notify",&local_80d);
  pMVar14 = local_6f8;
  MthdDmaNotify::SingleMthdTest
            (local_6f8,opt,(uint32_t)rVar20,&local_220,1,(this->super_Class).cls,0x180,1,4);
  local_160 = pMVar14;
  local_700 = (MthdCtxPattern *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_240,"ctx_pattern",&local_80e);
  pMVar13 = local_700;
  MthdCtxPattern::MthdCtxPattern
            (local_700,opt,(uint32_t)rVar20,&local_240,3,(this->super_Class).cls,0x184,false);
  local_158 = pMVar13;
  local_708 = (MthdCtxRop *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_260,"ctx_rop",&local_80f);
  pMVar12 = local_708;
  MthdCtxRop::SingleMthdTest
            (local_708,opt,(uint32_t)rVar20,&local_260,4,(this->super_Class).cls,0x188,1,4);
  local_150 = pMVar12;
  local_710 = (MthdCtxBeta *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_280,"ctx_beta",&local_810);
  pMVar11 = local_710;
  MthdCtxBeta::SingleMthdTest
            (local_710,opt,(uint32_t)rVar20,&local_280,5,(this->super_Class).cls,0x18c,1,4);
  local_148 = pMVar11;
  local_718 = (MthdCtxSurf *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2a0,"ctx_dst",&local_811);
  pMVar10 = local_718;
  MthdCtxSurf::MthdCtxSurf
            (local_718,opt,(uint32_t)rVar20,&local_2a0,7,(this->super_Class).cls,400,0);
  local_140 = pMVar10;
  local_720 = (MthdMissing *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2c0,"missing",&local_812);
  pMVar9 = local_720;
  MthdMissing::SingleMthdTest
            (local_720,opt,(uint32_t)rVar20,&local_2c0,-1,(this->super_Class).cls,0x200,1,4);
  local_138 = pMVar9;
  local_728 = (MthdOperation *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2e0,"operation",&local_813);
  pMVar8 = local_728;
  MthdOperation::MthdOperation
            (local_728,opt,(uint32_t)rVar20,&local_2e0,8,(this->super_Class).cls,0x2fc,false);
  local_130 = pMVar8;
  local_730 = (MthdSolidFormat *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_300,"format",&local_814);
  pMVar7 = local_730;
  MthdSolidFormat::MthdSolidFormat
            (local_730,opt,(uint32_t)rVar20,&local_300,9,(this->super_Class).cls,0x300,false);
  local_128 = pMVar7;
  local_738 = (MthdBitmapFormat *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_320,"bitmap_format",&local_815);
  pMVar6 = local_738;
  MthdBitmapFormat::SingleMthdTest
            (local_738,opt,(uint32_t)rVar20,&local_320,10,(this->super_Class).cls,0x304,1,4);
  local_120 = pMVar6;
  local_740 = (MthdSolidColor *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_340,"a.color",&local_816);
  pMVar4 = local_740;
  MthdSolidColor::SingleMthdTest
            (local_740,opt,(uint32_t)rVar20,&local_340,0xb,(this->super_Class).cls,0x3fc,1,4);
  local_118 = pMVar4;
  local_748 = (MthdVtxXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_360,"a.xy",&local_817);
  pMVar22 = local_748;
  MthdVtxXy::MthdVtxXy
            (local_748,opt,(uint32_t)rVar20,&local_360,0xe,(this->super_Class).cls,0x400,0x40,8,0x11
            );
  local_110 = pMVar22;
  local_750 = (MthdRect *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_380,"a.rect",&local_818);
  pMVar5 = local_750;
  MthdRect::MthdRect(local_750,opt,(uint32_t)rVar20,&local_380,0xf,(this->super_Class).cls,0x404,
                     0x40,8,0x14);
  local_108 = pMVar5;
  local_758 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3a0,"b.clip_xy_0",&local_819);
  pMVar3 = local_758;
  MthdClipXy::MthdClipXy
            (local_758,opt,(uint32_t)rVar20,&local_3a0,0x10,(this->super_Class).cls,0x7f4,1,false);
  local_100 = pMVar3;
  local_760 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3c0,"b.clip_xy_1",&local_81a);
  pMVar3 = local_760;
  MthdClipXy::MthdClipXy
            (local_760,opt,(uint32_t)rVar20,&local_3c0,0x11,(this->super_Class).cls,0x7f8,1,true);
  local_f8 = pMVar3;
  local_768 = (MthdSolidColor *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3e0,"b.color",&local_81b);
  pMVar4 = local_768;
  MthdSolidColor::SingleMthdTest
            (local_768,opt,(uint32_t)rVar20,&local_3e0,0xb,(this->super_Class).cls,0x7fc,1,4);
  local_f0 = pMVar4;
  local_770 = (MthdVtxXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_400,"b.0.xy",&local_81c);
  pMVar22 = local_770;
  MthdVtxXy::MthdVtxXy
            (local_770,opt,(uint32_t)rVar20,&local_400,0x12,(this->super_Class).cls,0x800,0x40,8,1);
  local_e8 = pMVar22;
  local_778 = (MthdVtxXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_420,"b.1.xy",&local_81d);
  pMVar22 = local_778;
  MthdVtxXy::MthdVtxXy
            (local_778,opt,(uint32_t)rVar20,&local_420,-1,(this->super_Class).cls,0x804,0x40,8,4);
  local_e0 = pMVar22;
  local_780 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_440,"c.clip_xy_0",&local_81e);
  pMVar3 = local_780;
  MthdClipXy::MthdClipXy
            (local_780,opt,(uint32_t)rVar20,&local_440,0x10,(this->super_Class).cls,0xbec,1,false);
  local_d8 = pMVar3;
  local_788 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_460,"c.clip_xy_1",&local_81f);
  pMVar3 = local_788;
  MthdClipXy::MthdClipXy
            (local_788,opt,(uint32_t)rVar20,&local_460,0x11,(this->super_Class).cls,0xbf0,1,true);
  local_d0 = pMVar3;
  local_790 = (MthdBitmapColor1 *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_480,"c.color",&local_820);
  pMVar1 = local_790;
  MthdBitmapColor1::SingleMthdTest
            (local_790,opt,(uint32_t)rVar20,&local_480,0xc,(this->super_Class).cls,0xbf4,1,4);
  local_c8 = pMVar1;
  local_798 = (MthdIfcSize *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4a0,"c.size",&local_821);
  pMVar21 = local_798;
  MthdIfcSize::MthdIfcSize
            (local_798,opt,(uint32_t)rVar20,&local_4a0,0x15,(this->super_Class).cls,0xbf8,0x16);
  local_c0 = pMVar21;
  local_7a0 = (MthdVtxXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4c0,"c.xy",&local_822);
  pMVar22 = local_7a0;
  MthdVtxXy::MthdVtxXy
            (local_7a0,opt,(uint32_t)rVar20,&local_4c0,0x14,(this->super_Class).cls,0xbfc,1,4,0x21);
  local_b8 = pMVar22;
  local_7a8 = (MthdBitmapData *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4e0,"c.bitmap_data",&local_823);
  pMVar23 = local_7a8;
  MthdBitmapData::MthdBitmapData
            (local_7a8,opt,(uint32_t)rVar20,&local_4e0,0x18,(this->super_Class).cls,0xc00,0x80,4,
             false);
  local_b0 = pMVar23;
  local_7b0 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_500,"d.clip_xy_0",&local_824);
  pMVar3 = local_7b0;
  MthdClipXy::MthdClipXy
            (local_7b0,opt,(uint32_t)rVar20,&local_500,0x10,(this->super_Class).cls,0xfe8,1,false);
  local_a8 = pMVar3;
  local_7b8 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_520,"d.clip_xy_1",&local_825);
  pMVar3 = local_7b8;
  MthdClipXy::MthdClipXy
            (local_7b8,opt,(uint32_t)rVar20,&local_520,0x11,(this->super_Class).cls,0xfec,1,true);
  local_a0 = pMVar3;
  local_7c0 = (MthdBitmapColor1 *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_540,"d.color",&local_826);
  pMVar1 = local_7c0;
  MthdBitmapColor1::SingleMthdTest
            (local_7c0,opt,(uint32_t)rVar20,&local_540,0xc,(this->super_Class).cls,0xff0,1,4);
  local_98 = pMVar1;
  local_7c8 = (MthdIfcSize *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_560,"d.size_in",&local_827);
  pMVar21 = local_7c8;
  MthdIfcSize::MthdIfcSize
            (local_7c8,opt,(uint32_t)rVar20,&local_560,0x16,(this->super_Class).cls,0xff4,0x12);
  local_90 = pMVar21;
  local_7d0 = (MthdIfcSize *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_580,"d.size_out",&local_828);
  pMVar21 = local_7d0;
  MthdIfcSize::MthdIfcSize
            (local_7d0,opt,(uint32_t)rVar20,&local_580,0x17,(this->super_Class).cls,0xff8,0x14);
  local_88 = pMVar21;
  local_7d8 = (MthdVtxXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_5a0,"d.xy",&local_829);
  pMVar22 = local_7d8;
  MthdVtxXy::MthdVtxXy
            (local_7d8,opt,(uint32_t)rVar20,&local_5a0,0x14,(this->super_Class).cls,0xffc,1,4,0x21);
  local_80 = pMVar22;
  local_7e0 = (MthdBitmapData *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_5c0,"d.bitmap_data",&local_82a);
  pMVar23 = local_7e0;
  MthdBitmapData::MthdBitmapData
            (local_7e0,opt,(uint32_t)rVar20,&local_5c0,0x18,(this->super_Class).cls,0x1000,0x80,4,
             false);
  local_78 = pMVar23;
  local_7e8 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_5e0,"e.clip_xy_0",&local_82b);
  pMVar3 = local_7e8;
  MthdClipXy::MthdClipXy
            (local_7e8,opt,(uint32_t)rVar20,&local_5e0,0x10,(this->super_Class).cls,0x13e4,1,false);
  local_70 = pMVar3;
  local_7f0 = (MthdClipXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_600,"e.clip_xy_1",&local_82c);
  pMVar3 = local_7f0;
  MthdClipXy::MthdClipXy
            (local_7f0,opt,(uint32_t)rVar20,&local_600,0x11,(this->super_Class).cls,0x13e8,1,true);
  local_68 = pMVar3;
  local_7f8 = (MthdBitmapColor0 *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_620,"e.color0",&local_82d);
  pMVar2 = local_7f8;
  MthdBitmapColor0::SingleMthdTest
            (local_7f8,opt,(uint32_t)rVar20,&local_620,0xd,(this->super_Class).cls,0x13ec,1,4);
  local_60 = pMVar2;
  local_800 = (MthdBitmapColor1 *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_640,"e.color1",&local_82e);
  pMVar1 = local_800;
  MthdBitmapColor1::SingleMthdTest
            (local_800,opt,(uint32_t)rVar20,&local_640,0xc,(this->super_Class).cls,0x13f0,1,4);
  local_58 = pMVar1;
  local_808 = (MthdIfcSize *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_660,"e.size_in",&local_82f);
  pMVar21 = local_808;
  MthdIfcSize::MthdIfcSize
            (local_808,opt,(uint32_t)rVar20,&local_660,0x16,(this->super_Class).cls,0x13f4,0x12);
  local_50 = pMVar21;
  pMVar21 = (MthdIfcSize *)operator_new(0x25958);
  local_6d0 = pMVar21;
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_680,"e.size_out",&local_830);
  MthdIfcSize::MthdIfcSize
            (pMVar21,opt,(uint32_t)rVar20,&local_680,0x17,(this->super_Class).cls,0x13f8,0x14);
  local_48 = pMVar21;
  pMVar22 = (MthdVtxXy *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_6a0,"e.xy",&local_831);
  MthdVtxXy::MthdVtxXy
            (pMVar22,opt,(uint32_t)rVar20,&local_6a0,0x14,(this->super_Class).cls,0x13fc,1,4,0x21);
  local_40 = pMVar22;
  pMVar23 = (MthdBitmapData *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_6c0,"e.bitmap_data",&local_832);
  MthdBitmapData::MthdBitmapData
            (pMVar23,opt,(uint32_t)rVar20,&local_6c0,0x19,(this->super_Class).cls,0x1400,0x80,4,true
            );
  pvVar19 = local_6c8;
  __l._M_len = 0x2a;
  __l._M_array = &local_180;
  local_38 = pMVar23;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_6c8,__l,&local_833);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  return pvVar19;
}

Assistant:

std::vector<SingleMthdTest *> GdiNv3::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x184, false),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x188),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x18c),
		new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x190, 0),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, false),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, false),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 10, cls, 0x304),
		new MthdSolidColor(opt, rnd(), "a.color", 11, cls, 0x3fc),
		new MthdVtxXy(opt, rnd(), "a.xy", 14, cls, 0x400, 0x40, 8, VTX_FIRST | VTX_NOCLIP),
		new MthdRect(opt, rnd(), "a.rect", 15, cls, 0x404, 0x40, 8, VTX_DRAW | VTX_NOCLIP),
		new MthdClipXy(opt, rnd(), "b.clip_xy_0", 16, cls, 0x7f4, 1, 0),
		new MthdClipXy(opt, rnd(), "b.clip_xy_1", 17, cls, 0x7f8, 1, 1),
		new MthdSolidColor(opt, rnd(), "b.color", 11, cls, 0x7fc),
		new MthdVtxXy(opt, rnd(), "b.0.xy", 18, cls, 0x800, 0x40, 8, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "b.1.xy", -1, cls, 0x804, 0x40, 8, VTX_DRAW),
		new MthdClipXy(opt, rnd(), "c.clip_xy_0", 16, cls, 0xbec, 1, 0),
		new MthdClipXy(opt, rnd(), "c.clip_xy_1", 17, cls, 0xbf0, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "c.color", 12, cls, 0xbf4),
		new MthdIfcSize(opt, rnd(), "c.size", 21, cls, 0xbf8, IFC_IN | IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "c.xy", 20, cls, 0xbfc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "c.bitmap_data", 24, cls, 0xc00, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "d.clip_xy_0", 16, cls, 0xfe8, 1, 0),
		new MthdClipXy(opt, rnd(), "d.clip_xy_1", 17, cls, 0xfec, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "d.color", 12, cls, 0xff0),
		new MthdIfcSize(opt, rnd(), "d.size_in", 22, cls, 0xff4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "d.size_out", 23, cls, 0xff8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "d.xy", 20, cls, 0xffc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "d.bitmap_data", 24, cls, 0x1000, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "e.clip_xy_0", 16, cls, 0x13e4, 1, 0),
		new MthdClipXy(opt, rnd(), "e.clip_xy_1", 17, cls, 0x13e8, 1, 1),
		new MthdBitmapColor0(opt, rnd(), "e.color0", 13, cls, 0x13ec),
		new MthdBitmapColor1(opt, rnd(), "e.color1", 12, cls, 0x13f0),
		new MthdIfcSize(opt, rnd(), "e.size_in", 22, cls, 0x13f4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "e.size_out", 23, cls, 0x13f8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "e.xy", 20, cls, 0x13fc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "e.bitmap_data", 25, cls, 0x1400, 0x80, 4, true),
	};
}